

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O2

BinaryOperator slang::ast::OpInfo::getBinary(SyntaxKind kind)

{
  __index_type _Var1;
  real_t rVar2;
  bool bVar3;
  logic_t lVar4;
  logic_t lVar5;
  BinaryOperator BVar6;
  size_t sVar7;
  size_t sVar8;
  TRef cvl;
  TRef cvr;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  uint *__v;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *in_RDX;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *this;
  BinaryOperator in_ESI;
  undefined4 in_register_0000003c;
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  SVInt *in_R8;
  _anonymous_namespace_ *this_01;
  bool bVar10;
  shortreal_t sVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double in_XMM1_Qa;
  logic_t lStack_d9;
  undefined1 auStack_d8 [16];
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aaStack_c0 [5];
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  *pvStack_98;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aaStack_90 [4];
  char cStack_70;
  _Variadic_union<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
  _Stack_68;
  SVInt SStack_40;
  
  this_00 = (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
             *)CONCAT44(in_register_0000003c,kind);
  __v = &switchD_0033dece::switchdataD_00420098;
  switch(kind) {
  case LessThanEqualExpression:
    return LessThanEqual;
  case LessThanExpression:
    return LessThan;
  case LetDeclaration:
  case LibraryDeclaration:
  case LibraryIncDirClause:
  case LibraryIncludeStatement:
  case LibraryMap:
  case LineDirective:
  case LocalScope:
  case LocalVariableDeclaration:
  case LogicType:
    goto code_r0x0033df5e;
  case LogicalAndExpression:
    return LogicalAnd;
  case LogicalEquivalenceExpression:
    return LogicalEquivalence;
  case LogicalImplicationExpression:
    return LogicalImplication;
  case LogicalLeftShiftAssignmentExpression:
  case LogicalShiftLeftExpression:
    return LogicalShiftLeft;
  case LogicalOrExpression:
    return LogicalOr;
  case LogicalRightShiftAssignmentExpression:
  case LogicalShiftRightExpression:
    return LogicalShiftRight;
  }
  __v = &switchD_0033dee5::switchdataD_00420034;
  switch(kind) {
  case AddAssignmentExpression:
  case AddExpression:
    return Add;
  case AlwaysBlock:
  case AlwaysCombBlock:
  case AlwaysFFBlock:
  case AlwaysLatchBlock:
  case AndPropertyExpr:
  case AndSequenceExpr:
  case AnonymousProgram:
  case AnsiPortList:
  case AnsiUdpPortList:
  case ArgumentList:
    goto code_r0x0033df5e;
  case AndAssignmentExpression:
switchD_0033def8_caseD_29:
    BVar6 = BinaryAnd;
    break;
  case ArithmeticLeftShiftAssignmentExpression:
  case ArithmeticShiftLeftExpression:
    BVar6 = ArithmeticShiftLeft;
    break;
  case ArithmeticRightShiftAssignmentExpression:
  case ArithmeticShiftRightExpression:
    BVar6 = ArithmeticShiftRight;
    break;
  default:
    __v = &switchD_0033def8::switchdataD_00420078;
    switch(kind) {
    case BinaryAndExpression:
      goto switchD_0033def8_caseD_29;
    case BinaryBinsSelectExpr:
    case BinaryBlockEventExpression:
    case BinaryConditionalDirectiveExpression:
    case BinaryEventExpression:
      goto code_r0x0033df5e;
    case BinaryOrExpression:
      return BinaryOr;
    case BinaryXnorExpression:
      return BinaryXnor;
    case BinaryXorExpression:
      return BinaryXor;
    default:
      if (kind == CaseEqualityExpression) {
        return CaseEquality;
      }
      if (kind == CaseInequalityExpression) {
        return CaseInequality;
      }
      if ((kind == DivideAssignmentExpression) || (kind == DivideExpression)) {
        return Divide;
      }
      if (kind == EqualityExpression) {
        return Equality;
      }
      if (kind == GreaterThanEqualExpression) {
        return GreaterThanEqual;
      }
      if (kind == GreaterThanExpression) {
        return GreaterThan;
      }
      if (kind == InequalityExpression) {
        return Inequality;
      }
      if ((kind == ModAssignmentExpression) || (kind == ModExpression)) {
        return Mod;
      }
      if ((kind != MultiplyAssignmentExpression) && (kind != MultiplyExpression)) {
        if (kind == OrAssignmentExpression) {
          return BinaryOr;
        }
        if (kind == PowerExpression) {
          return Power;
        }
        if (kind != SubtractAssignmentExpression) {
          if (kind == XorAssignmentExpression) {
            return BinaryXor;
          }
          if (kind == WildcardEqualityExpression) {
            return WildcardEquality;
          }
          if (kind == WildcardInequalityExpression) {
            return WildcardInequality;
          }
        }
        return Subtract;
      }
      return Multiply;
    }
  }
  return BVar6;
code_r0x0033df5e:
  _Var1 = (in_RDX->
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ).
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._M_index;
  if ((_Var1 == '\0') ||
     ((((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         *)__v)->
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ).
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0')) {
    this_00[0x20] =
         (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          )0x0;
    goto switchD_0033e201_default;
  }
  this_01 = (_anonymous_namespace_ *)(ulong)in_ESI;
  switch(_Var1) {
  case '\x01':
    pvVar9 = std::
             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x03') {
      sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
      bVar3 = NAN(sVar11.v);
      bVar10 = sVar11.v == 0.0;
LAB_0033e3e3:
      aaStack_c0[0]._0_1_ = !bVar10 | bVar3;
      (anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
                ((ConstantValue *)this_00,this_01,(BinaryOperator)pvVar9,(SVInt *)aaStack_c0,
                 (bool *)in_R8);
      goto switchD_0033e201_default;
    }
    if (_Var1 == '\x02') {
      rVar2 = ConstantValue::real((ConstantValue *)__v);
      bVar3 = NAN(rVar2.v);
      bVar10 = rVar2.v == 0.0;
      goto LAB_0033e3e3;
    }
    if (_Var1 != '\x01') goto switchD_0033e201_default;
    break;
  case '\x02':
    rVar2 = ConstantValue::real((ConstantValue *)in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x01') {
      bVar3 = NAN(rVar2.v);
      bVar10 = rVar2.v == 0.0;
LAB_0033e40a:
      aaStack_c0[0]._0_1_ = !bVar10 | bVar3;
      pvVar9 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)__v);
      (anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>
                ((ConstantValue *)this_00,this_01,(BinaryOperator)aaStack_c0,(bool *)pvVar9,in_R8);
      goto switchD_0033e201_default;
    }
    if (_Var1 != '\x03') {
      if (_Var1 == '\x02') {
        auStack_d8._8_4_ = extraout_XMM0_Dc_00;
        auStack_d8._0_8_ = rVar2.v;
        auStack_d8._12_4_ = extraout_XMM0_Dd_00;
        rVar2 = ConstantValue::real((ConstantValue *)__v);
        BVar6 = (*(code *)(&DAT_004201a4 + *(int *)(&DAT_004201a4 + (long)this_01 * 4)))
                          (SUB84(rVar2.v,0),rVar2.v);
        return BVar6;
      }
      goto switchD_0033e201_default;
    }
    aaStack_c0[0]._0_1_ = rVar2.v != 0.0;
    sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
    bVar3 = NAN(sVar11.v);
    bVar10 = sVar11.v == 0.0;
    goto LAB_0033e36e;
  case '\x03':
    auStack_d8._0_4_ = ConstantValue::shortReal((ConstantValue *)in_RDX);
    _Var1 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var1 == '\x01') {
      bVar3 = NAN((float)auStack_d8._0_4_);
      bVar10 = (float)auStack_d8._0_4_ == 0.0;
      goto LAB_0033e40a;
    }
    if (_Var1 != '\x02') {
      if (_Var1 == '\x03') {
        auStack_d8._4_4_ = extraout_XMM0_Db;
        auStack_d8._8_4_ = extraout_XMM0_Dc;
        auStack_d8._12_4_ = extraout_XMM0_Dd;
        sVar11 = ConstantValue::shortReal((ConstantValue *)__v);
        BVar6 = (*(code *)(&DAT_00420134 + *(int *)(&DAT_00420134 + (long)this_01 * 4)))
                          (sVar11.v,sVar11.v);
        return BVar6;
      }
      goto switchD_0033e201_default;
    }
    aaStack_c0[0]._0_1_ = (float)auStack_d8._0_4_ != 0.0;
    rVar2 = ConstantValue::real((ConstantValue *)__v);
    bVar3 = NAN(rVar2.v);
    bVar10 = rVar2.v == 0.0;
LAB_0033e36e:
    _Stack_68._0_1_ = !bVar10 || bVar3;
    (anonymous_namespace)::evalLogicalOp<bool,bool>
              ((ConstantValue *)this_00,this_01,(BinaryOperator)aaStack_c0,(bool *)&_Stack_68,
               (bool *)in_R8);
    goto switchD_0033e201_default;
  case '\x04':
    BVar6 = (*(code *)(&DAT_00420104 + *(int *)(&DAT_00420104 + (ulong)(in_ESI - Equality) * 4)))();
    return BVar6;
  case '\x05':
  case '\a':
  case '\b':
    sVar7 = ConstantValue::size((ConstantValue *)in_RDX);
    sVar8 = ConstantValue::size((ConstantValue *)__v);
    if (sVar7 == sVar8) {
      begin<const_slang::ConstantValue,_true>
                ((CVIterator<true> *)aaStack_c0,(ConstantValue *)in_RDX);
      begin<const_slang::ConstantValue,_true>
                ((CVIterator<true> *)&_Stack_68._M_first,(ConstantValue *)__v);
      auStack_d8._0_8_ = in_RDX;
      pvStack_98 = this_00;
      while( true ) {
        this_00 = pvStack_98;
        end<const_slang::ConstantValue,_true>
                  ((CVIterator<true> *)aaStack_90,(ConstantValue *)in_RDX);
        bVar3 = std::operator==((variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                 *)aaStack_c0,
                                (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                 *)aaStack_90);
        if (bVar3) break;
        cvl = CVIterator<true>::dereference((CVIterator<true> *)aaStack_c0);
        cvr = CVIterator<true>::dereference((CVIterator<true> *)&_Stack_68._M_first);
        eval((ConstantValue *)aaStack_90,in_ESI,cvl,cvr);
        if (cStack_70 == '\0') {
          this_00[0x20] =
               (variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                )0x0;
LAB_0033e2f3:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)aaStack_90);
          goto switchD_0033e201_default;
        }
        pvVar9 = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)aaStack_90);
        lVar4 = SVInt::reductionOr(pvVar9);
        lStack_d9 = lVar4;
        lVar5 = logic_t::operator!(&lStack_d9);
        if (((lVar4.value == 0x80) || (lVar4.value == '@')) ||
           ((lVar5.value != '\0' && ((lVar5.value != 0x80 && (lVar5.value != '@')))))) {
          SVInt::SVInt(&SStack_40,lStack_d9);
          this_00 = pvStack_98;
          std::
          variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          ::variant<slang::SVInt,void,void,slang::SVInt,void>(pvStack_98,&SStack_40);
          SVInt::~SVInt(&SStack_40);
          goto LAB_0033e2f3;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)aaStack_90);
        iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                  ((self_type *)aaStack_90,
                   (iterator_facade<slang::CVIterator<true>,_false> *)aaStack_c0,0);
        iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                  ((self_type *)aaStack_90,
                   (iterator_facade<slang::CVIterator<true>,_false> *)&_Stack_68._M_first,0);
        in_RDX = (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)auStack_d8._0_8_;
      }
      this = aaStack_90;
      bVar3 = true;
    }
    else {
      this = aaStack_c0;
      bVar3 = false;
    }
    SVInt::SVInt<bool>((SVInt *)this,bVar3);
    goto LAB_0033e3ad;
  case '\x06':
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              (in_RDX);
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)__v);
    BVar6 = (*(code *)(&DAT_00420114 + *(int *)(&DAT_00420114 + (ulong)(in_ESI - Equality) * 4)))();
    return BVar6;
  default:
    BVar6 = (*(code *)(&DAT_00420284 + *(int *)(&DAT_00420284 + (ulong)(in_ESI - Equality) * 4)))();
    return BVar6;
  }
  rhs = std::
        get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)__v);
  switch(this_01) {
  case (_anonymous_namespace_ *)0x0:
    this = aaStack_c0;
    SVInt::operator+((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x1:
    this = aaStack_c0;
    SVInt::operator-((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x2:
    this = aaStack_c0;
    SVInt::operator*((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x3:
    this = aaStack_c0;
    SVInt::operator/((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x4:
    this = aaStack_c0;
    SVInt::operator%((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x5:
    this = aaStack_c0;
    SVInt::operator&((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x6:
    this = aaStack_c0;
    SVInt::operator|((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x7:
    this = aaStack_c0;
    SVInt::operator^((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x8:
    this = aaStack_c0;
    SVInt::xnor((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x9:
    lVar4 = SVInt::operator==(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xa:
    lVar4 = SVInt::operator!=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xb:
    lVar4.value = exactlyEqual(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xc:
    bVar3 = exactlyEqual(pvVar9,rhs);
    lVar4.value = !bVar3;
    break;
  case (_anonymous_namespace_ *)0xd:
    lVar4 = SVInt::operator>=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xe:
    lVar4 = SVInt::operator>(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0xf:
    lVar4 = SVInt::operator<=(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x10:
    lVar4 = SVInt::operator<(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x11:
    lVar4 = condWildcardEqual(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x12:
    _Stack_68._0_1_ = condWildcardEqual(pvVar9,rhs);
    lVar4 = logic_t::operator!((logic_t *)&_Stack_68._M_first);
    break;
  case (_anonymous_namespace_ *)0x13:
    lVar4 = SVInt::operator&&(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x14:
    lVar4 = SVInt::operator||(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x15:
    lVar4 = SVInt::logicalImpl(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x16:
    lVar4 = SVInt::logicalEquiv(pvVar9,rhs);
    break;
  case (_anonymous_namespace_ *)0x17:
  case (_anonymous_namespace_ *)0x19:
    this = aaStack_c0;
    SVInt::shl((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x18:
    this = aaStack_c0;
    SVInt::lshr((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x1a:
    this = aaStack_c0;
    SVInt::ashr((SVInt *)this,pvVar9);
    goto LAB_0033e3ad;
  case (_anonymous_namespace_ *)0x1b:
    this = aaStack_c0;
    SVInt::pow((SVInt *)this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da),in_XMM1_Qa);
    goto LAB_0033e3ad;
  default:
    goto switchD_0033e201_default;
  }
  this = aaStack_c0;
  SVInt::SVInt((SVInt *)this,lVar4);
LAB_0033e3ad:
  std::
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  ::variant<slang::SVInt,void,void,slang::SVInt,void>(this_00,(SVInt *)this);
  SVInt::~SVInt((SVInt *)this);
switchD_0033e201_default:
  return (BinaryOperator)this_00;
}

Assistant:

BinaryOperator OpInfo::getBinary(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            SLANG_UNREACHABLE;
    }
}